

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_publisher.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  tm *__tp;
  size_t sVar4;
  char local_e58 [8];
  char application_message [256];
  char timebuf [26];
  tm *tm_info;
  time_t timer;
  pthread_t client_daemon;
  undefined8 uStack_d10;
  uint8_t connect_flags;
  char *client_id;
  uint8_t recvbuf [1024];
  uint8_t sendbuf [2048];
  undefined1 local_100 [8];
  mqtt_client client;
  char *pcStack_30;
  int sockfd;
  char *topic;
  char *port;
  char *addr;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    port = "test.mosquitto.org";
  }
  else {
    port = argv[1];
  }
  if (argc < 3) {
    topic = "1883";
  }
  else {
    topic = argv[2];
  }
  if (argc < 4) {
    pcStack_30 = "datetime";
  }
  else {
    pcStack_30 = argv[3];
  }
  client.mq.queue_tail._4_4_ = open_nb_socket(port,topic);
  if (client.mq.queue_tail._4_4_ == -1) {
    perror("Failed to open socket: ");
    exit_example(1,client.mq.queue_tail._4_4_,(pthread_t *)0x0);
  }
  mqtt_init((mqtt_client *)local_100,client.mq.queue_tail._4_4_,recvbuf + 0x3f8,0x800,
            (uint8_t *)&client_id,0x400,publish_callback);
  uStack_d10 = 0;
  client_daemon._7_1_ = 2;
  mqtt_connect((mqtt_client *)local_100,(char *)0x0,(char *)0x0,(void *)0x0,0,(char *)0x0,
               (char *)0x0,'\x02',400);
  pFVar1 = _stderr;
  if ((MQTTErrors)client.time_of_last_send != MQTT_OK) {
    pcVar3 = mqtt_error_str((MQTTErrors)client.time_of_last_send);
    fprintf(pFVar1,"error: %s\n",pcVar3);
    exit_example(1,client.mq.queue_tail._4_4_,(pthread_t *)0x0);
  }
  iVar2 = pthread_create((pthread_t *)&timer,(pthread_attr_t *)0x0,client_refresher,local_100);
  if (iVar2 != 0) {
    fprintf(_stderr,"Failed to start client daemon.\n");
    exit_example(1,client.mq.queue_tail._4_4_,(pthread_t *)0x0);
  }
  printf("%s is ready to begin publishing the time.\n",*argv);
  printf("Press ENTER to publish the current time.\n");
  printf("Press CTRL-D (or any other key) to exit.\n\n");
  while (iVar2 = fgetc(_stdin), iVar2 == 10) {
    time((time_t *)&tm_info);
    __tp = localtime((time_t *)&tm_info);
    strftime(application_message + 0xf8,0x1a,"%Y-%m-%d %H:%M:%S",__tp);
    snprintf(local_e58,0x100,"The time is %s",application_message + 0xf8);
    printf("%s published : \"%s\"",*argv,local_e58);
    sVar4 = strlen(local_e58);
    mqtt_publish((mqtt_client *)local_100,pcStack_30,local_e58,sVar4 + 1,'\0');
    pFVar1 = _stderr;
    if ((MQTTErrors)client.time_of_last_send != MQTT_OK) {
      pcVar3 = mqtt_error_str((MQTTErrors)client.time_of_last_send);
      fprintf(pFVar1,"error: %s\n",pcVar3);
      exit_example(1,client.mq.queue_tail._4_4_,(pthread_t *)&timer);
    }
  }
  printf("\n%s disconnecting from %s\n",*argv,port);
  sleep(1);
  exit_example(0,client.mq.queue_tail._4_4_,(pthread_t *)&timer);
  return 0;
}

Assistant:

int main(int argc, const char *argv[])
{
    const char* addr;
    const char* port;
    const char* topic;

    /* get address (argv[1] if present) */
    if (argc > 1) {
        addr = argv[1];
    } else {
        addr = "test.mosquitto.org";
    }

    /* get port number (argv[2] if present) */
    if (argc > 2) {
        port = argv[2];
    } else {
        port = "1883";
    }

    /* get the topic name to publish */
    if (argc > 3) {
        topic = argv[3];
    } else {
        topic = "datetime";
    }

    /* open the non-blocking TCP socket (connecting to the broker) */
    int sockfd = open_nb_socket(addr, port);

    if (sockfd == -1) {
        perror("Failed to open socket: ");
        exit_example(EXIT_FAILURE, sockfd, NULL);
    }

    /* setup a client */
    struct mqtt_client client;
    uint8_t sendbuf[2048]; /* sendbuf should be large enough to hold multiple whole mqtt messages */
    uint8_t recvbuf[1024]; /* recvbuf should be large enough any whole mqtt message expected to be received */
    mqtt_init(&client, sockfd, sendbuf, sizeof(sendbuf), recvbuf, sizeof(recvbuf), publish_callback);
    /* Create an anonymous session */
    const char* client_id = NULL;
    /* Ensure we have a clean session */
    uint8_t connect_flags = MQTT_CONNECT_CLEAN_SESSION;
    /* Send connection request to the broker. */
    mqtt_connect(&client, client_id, NULL, NULL, 0, NULL, NULL, connect_flags, 400);

    /* check that we don't have any errors */
    if (client.error != MQTT_OK) {
        fprintf(stderr, "error: %s\n", mqtt_error_str(client.error));
        exit_example(EXIT_FAILURE, sockfd, NULL);
    }

    /* start a thread to refresh the client (handle egress and ingree client traffic) */
    pthread_t client_daemon;
    if(pthread_create(&client_daemon, NULL, client_refresher, &client)) {
        fprintf(stderr, "Failed to start client daemon.\n");
        exit_example(EXIT_FAILURE, sockfd, NULL);

    }

    /* start publishing the time */
    printf("%s is ready to begin publishing the time.\n", argv[0]);
    printf("Press ENTER to publish the current time.\n");
    printf("Press CTRL-D (or any other key) to exit.\n\n");
    while(fgetc(stdin) == '\n') {
        /* get the current time */
        time_t timer;
        time(&timer);
        struct tm* tm_info = localtime(&timer);
        char timebuf[26];
        strftime(timebuf, 26, "%Y-%m-%d %H:%M:%S", tm_info);

        /* print a message */
        char application_message[256];
        snprintf(application_message, sizeof(application_message), "The time is %s", timebuf);
        printf("%s published : \"%s\"", argv[0], application_message);

        /* publish the time */
        mqtt_publish(&client, topic, application_message, strlen(application_message) + 1, MQTT_PUBLISH_QOS_0);

        /* check for errors */
        if (client.error != MQTT_OK) {
            fprintf(stderr, "error: %s\n", mqtt_error_str(client.error));
            exit_example(EXIT_FAILURE, sockfd, &client_daemon);
        }
    }

    /* disconnect */
    printf("\n%s disconnecting from %s\n", argv[0], addr);
    sleep(1);

    /* exit */
    exit_example(EXIT_SUCCESS, sockfd, &client_daemon);
}